

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_algebraic.h
# Opt level: O0

void __thiscall
mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
          (AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *this,QuadAndLinTerms *le,
          AlgConRhs<_1> rr,bool fSort)

{
  byte in_DL;
  QuadAndLinTerms *in_RSI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  QuadAndLinTerms *in_stack_ffffffffffffffb8;
  
  BasicConstraint::BasicConstraint((BasicConstraint *)0x1bd2c0);
  QuadAndLinTerms::QuadAndLinTerms(in_RSI,in_stack_ffffffffffffffb8);
  *(undefined8 *)(in_RDI + 0x1d8) = in_XMM0_Qa;
  if ((in_DL & 1) != 0) {
    sort_terms((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *)0x1bd2f5);
  }
  return;
}

Assistant:

AlgebraicConstraint(Body le, RhsOrRange rr, bool fSort=true)
    : Body(std::move(le)), RhsOrRange(std::move(rr))
  { if (fSort) sort_terms(); }